

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

int32_t __thiscall
icu_63::DayPeriodRules::getEndHourForDayPeriod
          (DayPeriodRules *this,DayPeriod dayPeriod,UErrorCode *errorCode)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (dayPeriod == DAYPERIOD_MIDNIGHT) {
      return 0;
    }
    if (dayPeriod == DAYPERIOD_NOON) {
      return 0xc;
    }
    if ((this->fDayPeriodForHour[0] == dayPeriod) && (this->fDayPeriodForHour[0x17] == dayPeriod)) {
      for (lVar1 = 2; lVar1 != 0x18; lVar1 = lVar1 + 1) {
        if (this->fDayPeriodForHour[lVar1 + -1] != dayPeriod) {
          return (int)lVar1 + -1;
        }
      }
    }
    else {
      uVar2 = 0x18;
      while (uVar3 = uVar2, uVar2 = uVar3 - 1, -1 < (int)uVar2) {
        if (this->fDayPeriodForHour[uVar2] == dayPeriod) {
          return uVar3;
        }
      }
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return -1;
}

Assistant:

int32_t DayPeriodRules::getEndHourForDayPeriod(
        DayPeriodRules::DayPeriod dayPeriod, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) { return -1; }

    if (dayPeriod == DAYPERIOD_MIDNIGHT) { return 0; }
    if (dayPeriod == DAYPERIOD_NOON) { return 12; }

    if (fDayPeriodForHour[0] == dayPeriod && fDayPeriodForHour[23] == dayPeriod) {
        // dayPeriod wraps around midnight. End hour is before start hour.
        for (int32_t i = 1; i <= 22; ++i) {
            if (fDayPeriodForHour[i] != dayPeriod) {
                // i o'clock is when a new period starts, therefore when the old period ends.
                return i;
            }
        }
    } else {
        for (int32_t i = 23; i >= 0; --i) {
            if (fDayPeriodForHour[i] == dayPeriod) {
                return (i + 1);
            }
        }
    }

    // dayPeriod doesn't exist in rule set; set error and exit.
    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
}